

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.cc
# Opt level: O1

bool __thiscall
absl::lts_20250127::StrContainsIgnoreCase(lts_20250127 *this,string_view haystack,char needle)

{
  bool bVar1;
  void *pvVar2;
  size_t __n;
  size_type sVar3;
  byte bVar4;
  char *__s;
  char both_cstr [3];
  char local_1b;
  char local_1a;
  undefined1 local_19;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  __s = (char *)haystack._M_len;
  bVar4 = (byte)haystack._M_str;
  local_1a = ascii_internal::kToUpper[bVar4];
  local_1b = ascii_internal::kToLower[bVar4];
  local_18._M_len = (size_t)this;
  local_18._M_str = __s;
  if (local_1a == local_1b) {
    if (this == (lts_20250127 *)0x0) {
      bVar1 = false;
    }
    else {
      pvVar2 = memchr(__s,(int)(char)bVar4,(size_t)this);
      bVar1 = (long)pvVar2 - (long)__s != -1 && pvVar2 != (void *)0x0;
    }
  }
  else {
    local_19 = 0;
    __n = strlen(&local_1b);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                      (&local_18,&local_1b,0,__n);
    bVar1 = sVar3 != 0xffffffffffffffff;
  }
  return bVar1;
}

Assistant:

bool StrContainsIgnoreCase(absl::string_view haystack,
                           char needle) noexcept {
  char upper_needle = absl::ascii_toupper(static_cast<unsigned char>(needle));
  char lower_needle = absl::ascii_tolower(static_cast<unsigned char>(needle));
  if (upper_needle == lower_needle) {
    return StrContains(haystack, needle);
  } else {
    const char both_cstr[3] = {lower_needle, upper_needle, '\0'};
    return haystack.find_first_of(both_cstr) != absl::string_view::npos;
  }
}